

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall
google::base::Logger::Write
          (Logger *this,bool force_flush,time_point *timestamp,char *message,size_t message_len)

{
  time_t tVar1;
  size_t message_len_local;
  char *message_local;
  time_point *timestamp_local;
  bool force_flush_local;
  Logger *this_local;
  
  tVar1 = std::chrono::_V2::system_clock::to_time_t(timestamp);
  (*this->_vptr_Logger[2])(this,(ulong)force_flush,tVar1,message,message_len);
  return;
}

Assistant:

void base::Logger::Write(bool force_flush,
                         const std::chrono::system_clock::time_point& timestamp,
                         const char* message, size_t message_len) {
#if defined(__GNUG__)
#  pragma GCC diagnostic push
#  pragma GCC diagnostic ignored "-Wdeprecated-declarations"
#elif defined(_MSC_VER)
#  pragma warning(push)
#  pragma warning(disable : 4996)
#endif  // __GNUG__
  return Write(force_flush, std::chrono::system_clock::to_time_t(timestamp),
               message, message_len);
#if defined(__GNUG__)
#  pragma GCC diagnostic pop
#elif defined(_MSC_VER)
#  pragma warning(pop)
#endif  // __GNUG__
}